

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

CTPNCodeBody * __thiscall
CTcParser::parse_nested_code_body
          (CTcParser *this,int eq_before_brace,int self_valid,int *p_argc,int *p_opt_argc,
          int *p_varargs,int *p_varargs_list,CTcSymLocal **p_varargs_list_local,int *p_has_retval,
          int *err,CTcPrsSymtab *local_symtab,tcprs_codebodytype cb_type)

{
  byte bVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  CTPNCodeBody *pCVar17;
  long in_RDI;
  int *in_stack_00000048;
  int *in_stack_00000050;
  int in_stack_0000005c;
  CTPNCodeBody *code_body;
  CTcCodeBodyRef *old_cur_code_body;
  int old_local_ctx_needs_full_method_ctx;
  int old_local_ctx_needs_self;
  int old_full_method_ctx_referenced;
  int old_self_referenced;
  int old_self_valid;
  int old_next_ctx_arr_idx;
  int old_ctx_var_props_used;
  int old_local_ctx_var_num;
  int old_has_local_ctx;
  int old_max_local_cnt;
  int old_local_cnt;
  CTcPrsSymtab *old_goto_symtab;
  CTPNStmEnclosing *old_enclosing_stm;
  CTcPrsSymtab *old_enclosing_local_symtab;
  CTcPrsSymtab *old_local_symtab;
  CTcCodeBodyRef *in_stack_000000e8;
  CTcFormalTypeList **in_stack_000000f0;
  
  uVar11 = *(undefined8 *)(in_RDI + 0xf8);
  uVar12 = *(undefined8 *)(in_RDI + 0x100);
  uVar13 = *(undefined8 *)(in_RDI + 0x118);
  uVar14 = *(undefined8 *)(in_RDI + 0xf0);
  uVar2 = *(undefined4 *)(in_RDI + 0x110);
  uVar3 = *(undefined4 *)(in_RDI + 0x114);
  bVar1 = *(byte *)(in_RDI + 0x1e8);
  uVar4 = *(undefined4 *)(in_RDI + 0x1ec);
  uVar15 = *(undefined8 *)(in_RDI + 0x208);
  uVar5 = *(undefined4 *)(in_RDI + 0x210);
  uVar6 = *(undefined4 *)(in_RDI + 0x220);
  uVar7 = *(undefined4 *)(in_RDI + 0x224);
  uVar8 = *(undefined4 *)(in_RDI + 0x228);
  uVar9 = *(undefined4 *)(in_RDI + 0x22c);
  uVar10 = *(undefined4 *)(in_RDI + 0x230);
  uVar16 = *(undefined8 *)(in_RDI + 0x218);
  pCVar17 = parse_code_body((CTcParser *)old_cur_code_body,code_body._4_4_,(int)code_body,
                            in_stack_0000005c,in_stack_00000050,in_stack_00000048,
                            (int *)old_goto_symtab,(int *)old_enclosing_stm,
                            (CTcSymLocal **)old_enclosing_local_symtab,(int *)old_local_symtab,
                            p_varargs,(CTcPrsSymtab *)p_opt_argc,(tcprs_codebodytype)p_argc,
                            (propset_def *)CONCAT44(eq_before_brace,self_valid),(int)this,
                            in_stack_000000e8,in_stack_000000f0);
  *(undefined8 *)(in_RDI + 0x218) = uVar16;
  *(undefined8 *)(in_RDI + 0xf8) = uVar11;
  *(undefined8 *)(in_RDI + 0x100) = uVar12;
  *(undefined8 *)(in_RDI + 0x118) = uVar13;
  *(undefined8 *)(in_RDI + 0xf0) = uVar14;
  *(undefined4 *)(in_RDI + 0x110) = uVar2;
  *(undefined4 *)(in_RDI + 0x114) = uVar3;
  *(byte *)(in_RDI + 0x1e8) = *(byte *)(in_RDI + 0x1e8) & 0xfe | bVar1 & 1;
  *(undefined4 *)(in_RDI + 0x1ec) = uVar4;
  *(long *)(in_RDI + 0x208) = (long)(int)uVar15;
  *(undefined4 *)(in_RDI + 0x210) = uVar5;
  *(undefined4 *)(in_RDI + 0x220) = uVar6;
  *(undefined4 *)(in_RDI + 0x224) = uVar7;
  *(undefined4 *)(in_RDI + 0x228) = uVar8;
  *(undefined4 *)(in_RDI + 0x22c) = uVar9;
  *(undefined4 *)(in_RDI + 0x230) = uVar10;
  return pCVar17;
}

Assistant:

CTPNCodeBody *CTcParser::parse_nested_code_body(
    int eq_before_brace, int self_valid,
    int *p_argc, int *p_opt_argc, int *p_varargs,
    int *p_varargs_list, CTcSymLocal **p_varargs_list_local,
    int *p_has_retval, int *err, CTcPrsSymtab *local_symtab,
    tcprs_codebodytype cb_type)
{
    /* remember the original parser state */
    CTcPrsSymtab *old_local_symtab = local_symtab_;
    CTcPrsSymtab *old_enclosing_local_symtab = enclosing_local_symtab_;
    CTPNStmEnclosing *old_enclosing_stm = enclosing_stm_;
    CTcPrsSymtab *old_goto_symtab = goto_symtab_;
    int old_local_cnt = local_cnt_;
    int old_max_local_cnt = max_local_cnt_;
    int old_has_local_ctx = has_local_ctx_;
    int old_local_ctx_var_num = local_ctx_var_num_;
    int old_ctx_var_props_used = ctx_var_props_used_;
    int old_next_ctx_arr_idx = next_ctx_arr_idx_;
    int old_self_valid = self_valid_;
    int old_self_referenced = self_referenced_;
    int old_full_method_ctx_referenced = full_method_ctx_referenced_;
    int old_local_ctx_needs_self = local_ctx_needs_self_;
    int old_local_ctx_needs_full_method_ctx = local_ctx_needs_full_method_ctx_;
    CTcCodeBodyRef *old_cur_code_body = cur_code_body_;

    /* parse the code body */
    CTPNCodeBody *code_body = parse_code_body(
        eq_before_brace, FALSE, self_valid,
        p_argc, p_opt_argc, p_varargs, p_varargs_list, p_varargs_list_local,
        p_has_retval, err, local_symtab, cb_type, 0, 0, cur_code_body_, 0);

    /* restore the parser state */
    cur_code_body_ = old_cur_code_body;
    local_symtab_ = old_local_symtab;
    enclosing_local_symtab_ = old_enclosing_local_symtab;
    enclosing_stm_ = old_enclosing_stm;
    goto_symtab_ = old_goto_symtab;
    local_cnt_ = old_local_cnt;
    max_local_cnt_ = old_max_local_cnt;
    has_local_ctx_ = old_has_local_ctx;
    local_ctx_var_num_ = old_local_ctx_var_num;
    ctx_var_props_used_ = old_ctx_var_props_used;
    next_ctx_arr_idx_ = old_next_ctx_arr_idx;
    self_valid_ = old_self_valid;
    self_referenced_ = old_self_referenced;
    full_method_ctx_referenced_= old_full_method_ctx_referenced;
    local_ctx_needs_self_ = old_local_ctx_needs_self;
    local_ctx_needs_full_method_ctx_ = old_local_ctx_needs_full_method_ctx;

    /* return the code body we parsed */
    return code_body;
}